

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::LinearSystem::dynamics
          (LinearSystem *this,VectorDynSize *state,double time,VectorDynSize *stateDynamics)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  size_t sVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar6;
  bool isValid;
  ostringstream errorMsg;
  char local_281;
  double local_280;
  PointerType local_278;
  long lStack_270;
  long local_268;
  PointerType local_258;
  long lStack_250;
  undefined1 local_248;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_const_Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  local_238 [3];
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_a0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_88;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  local_281 = '\0';
  peVar1 = (this->m_pimpl->stateMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_280 = time;
  iVar2 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_281);
  if (local_281 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::operator<<((ostream *)local_238,"Unable to retrieve a valid state matrix at time: ");
    poVar6 = std::ostream::_M_insert<double>(local_280);
    std::operator<<(poVar6,".");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamics",(char *)local_278);
  }
  else {
    sVar4 = iDynTree::MatrixDynSize::rows();
    sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
    if (sVar4 == sVar5) {
      sVar4 = iDynTree::MatrixDynSize::cols();
      sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
      if (sVar4 == sVar5) {
        local_281 = '\0';
        peVar1 = (this->m_pimpl->controlMatrix).
                 super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar3 = (*peVar1->_vptr_TimeVaryingObject[2])(SUB84(local_280,0),peVar1,&local_281);
        if (local_281 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::operator<<((ostream *)local_238,"Unable to retrieve a valid control matrix at time: "
                         );
          poVar6 = std::ostream::_M_insert<double>(local_280);
          std::operator<<(poVar6,".");
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("LinearSystem","dynamics",(char *)local_278);
        }
        else {
          sVar4 = iDynTree::MatrixDynSize::rows();
          sVar5 = DynamicalSystem::stateSpaceSize(&this->super_DynamicalSystem);
          if (sVar4 == sVar5) {
            sVar4 = iDynTree::MatrixDynSize::cols();
            sVar5 = DynamicalSystem::controlSpaceSize(&this->super_DynamicalSystem);
            if (sVar4 == sVar5) {
              toEigen(&local_50,(MatrixDynSize *)CONCAT44(extraout_var,iVar2));
              toEigen(&local_88,state);
              local_268 = local_50.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_cols.m_value;
              local_278 = local_50.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_270 = local_50.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              local_258 = local_88.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          .m_data;
              lStack_250 = local_88.
                           super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value;
              local_248 = local_88.
                          super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                          ._16_1_;
              toEigen(&local_70,(MatrixDynSize *)CONCAT44(extraout_var_00,iVar3));
              iVar2 = (*(this->super_DynamicalSystem)._vptr_DynamicalSystem[4])(this);
              toEigen(&local_a0,(VectorDynSize *)CONCAT44(extraout_var_01,iVar2));
              local_238[0].m_lhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value = local_268;
              local_238[0].m_lhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_278;
              local_238[0].m_lhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = lStack_270;
              local_238[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_258;
              local_238[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = lStack_250;
              local_238[0].m_lhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_ = local_248;
              local_238[0].m_rhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_70.
                        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              local_238[0].m_rhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value =
                   local_70.
                   super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              local_238[0].m_rhs.m_lhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value =
                   local_70.
                   super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_cols.m_value;
              local_238[0].m_rhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = local_a0.
                        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              local_238[0].m_rhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value =
                   local_a0.
                   super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_rows.m_value;
              local_238[0].m_rhs.m_rhs.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_ = local_a0.
                        super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        ._16_1_;
              toEigen(&local_b8,stateDynamics);
              Eigen::internal::
              call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>const,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,0>const>>
                        (&local_b8,local_238);
              return true;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
          std::operator<<((ostream *)local_238,"The control matrix at time: ");
          poVar6 = std::ostream::_M_insert<double>(local_280);
          std::operator<<(poVar6,
                          " has dimensions not matching with the specified state/control space dimension."
                         );
          std::__cxx11::stringbuf::str();
          iDynTree::reportError("LinearSystem","dynamics",(char *)local_278);
        }
        goto LAB_0017a729;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::operator<<((ostream *)local_238,"The state matrix at time: ");
    poVar6 = std::ostream::_M_insert<double>(local_280);
    std::operator<<(poVar6," has dimensions not matching with the specified state space dimension.")
    ;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("LinearSystem","dynamics",(char *)local_278);
  }
LAB_0017a729:
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  return false;
}

Assistant:

bool LinearSystem::dynamics(const VectorDynSize& state,
                                    double time,
                                    VectorDynSize& stateDynamics)
        {
            bool isValid = false;
            const MatrixDynSize& stateMatrix = m_pimpl->stateMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid state matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((stateMatrix.rows() != stateSpaceSize()) || (stateMatrix.cols() != stateSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The state matrix at time: " << time << " has dimensions not matching with the specified state space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            isValid = false;
            const MatrixDynSize& controlMatrix = m_pimpl->controlMatrix->get(time, isValid);

            if (!isValid) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to retrieve a valid control matrix at time: " << time << ".";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            if ((controlMatrix.rows() != stateSpaceSize()) || (controlMatrix.cols() != controlSpaceSize())) {
                std::ostringstream errorMsg;
                errorMsg << "The control matrix at time: " << time << " has dimensions not matching with the specified state/control space dimension.";
                reportError("LinearSystem", "dynamics", errorMsg.str().c_str());
                return false;
            }

            iDynTree::toEigen(stateDynamics) = iDynTree::toEigen(stateMatrix) * iDynTree::toEigen(state) + iDynTree::toEigen(controlMatrix) * iDynTree::toEigen(controlInput());
            return true;
        }